

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O0

void __thiscall ipx::LpSolver::PrintSummary(LpSolver *this)

{
  bool bVar1;
  ostream *poVar2;
  Control *in_RDI;
  stringstream h_logging_stream;
  double in_stack_fffffffffffffa68;
  stringstream *logging;
  Control *in_stack_fffffffffffffb60;
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [8];
  char (*in_stack_fffffffffffffc08) [45];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [28];
  Int in_stack_fffffffffffffddc;
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [48];
  string local_1b0 [32];
  stringstream local_190 [16];
  ostream local_180;
  
  std::__cxx11::stringstream::stringstream(local_190);
  std::__cxx11::string::string(local_1b0);
  std::__cxx11::stringstream::str((string *)local_190);
  std::__cxx11::string::~string(local_1b0);
  std::operator<<(&local_180,"Summary\n");
  bVar1 = Control::timelessLog(in_RDI);
  if (!bVar1) {
    Textline<char[9]>((char (*) [9])in_stack_fffffffffffffc08);
    poVar2 = std::operator<<(&local_180,local_1e0);
    Control::Elapsed((Control *)0x83807c);
    fix2_abi_cxx11_(in_stack_fffffffffffffa68);
    in_stack_fffffffffffffb60 = (Control *)std::operator<<(poVar2,local_200);
    std::operator<<((ostream *)in_stack_fffffffffffffb60,"s\n");
    std::__cxx11::string::~string(local_200);
    std::__cxx11::string::~string(local_1e0);
  }
  logging = (stringstream *)&local_180;
  Textline<char[29]>((char (*) [29])in_stack_fffffffffffffc08);
  poVar2 = std::operator<<((ostream *)logging,local_220);
  StatusString_abi_cxx11_(in_stack_fffffffffffffddc);
  poVar2 = std::operator<<(poVar2,local_240);
  poVar2 = std::operator<<(poVar2,'\n');
  Textline<char[18]>((char (*) [18])in_stack_fffffffffffffc08);
  poVar2 = std::operator<<(poVar2,local_260);
  StatusString_abi_cxx11_(in_stack_fffffffffffffddc);
  poVar2 = std::operator<<(poVar2,local_280);
  std::operator<<(poVar2,'\n');
  std::__cxx11::string::~string(local_280);
  std::__cxx11::string::~string(local_260);
  std::__cxx11::string::~string(local_240);
  std::__cxx11::string::~string(local_220);
  Control::hLog(in_stack_fffffffffffffb60,logging);
  if ((*(int *)&in_RDI[1].parameters_.super_ipx_parameters.field_0x4 == 1) ||
     (*(int *)&in_RDI[1].parameters_.super_ipx_parameters.field_0x4 == 2)) {
    Textline<char[17]>((char (*) [17])in_stack_fffffffffffffc08);
    poVar2 = std::operator<<(&local_180,local_2a0);
    sci8_abi_cxx11_(in_stack_fffffffffffffa68);
    poVar2 = std::operator<<(poVar2,local_2c0);
    poVar2 = std::operator<<(poVar2,'\n');
    Textline<char[45]>(in_stack_fffffffffffffc08);
    poVar2 = std::operator<<(poVar2,local_2e0);
    sci2_abi_cxx11_(in_stack_fffffffffffffa68);
    poVar2 = std::operator<<(poVar2,local_300);
    poVar2 = std::operator<<(poVar2," / ");
    sci2_abi_cxx11_(in_stack_fffffffffffffa68);
    poVar2 = std::operator<<(poVar2,local_320);
    poVar2 = std::operator<<(poVar2,'\n');
    Textline<char[43]>((char (*) [43])in_stack_fffffffffffffc08);
    poVar2 = std::operator<<(poVar2,local_340);
    sci2_abi_cxx11_(in_stack_fffffffffffffa68);
    poVar2 = std::operator<<(poVar2,local_360);
    poVar2 = std::operator<<(poVar2," / ");
    sci2_abi_cxx11_(in_stack_fffffffffffffa68);
    poVar2 = std::operator<<(poVar2,local_380);
    poVar2 = std::operator<<(poVar2,'\n');
    Textline<char[43]>((char (*) [43])in_stack_fffffffffffffc08);
    poVar2 = std::operator<<(poVar2,local_3a0);
    sci2_abi_cxx11_(in_stack_fffffffffffffa68);
    poVar2 = std::operator<<(poVar2,local_3c0);
    poVar2 = std::operator<<(poVar2," / ");
    sci2_abi_cxx11_(in_stack_fffffffffffffa68);
    poVar2 = std::operator<<(poVar2,local_3e0);
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string(local_3e0);
    std::__cxx11::string::~string(local_3c0);
    std::__cxx11::string::~string(local_3a0);
    std::__cxx11::string::~string(local_380);
    std::__cxx11::string::~string(local_360);
    std::__cxx11::string::~string(local_340);
    std::__cxx11::string::~string(local_320);
    std::__cxx11::string::~string(local_300);
    std::__cxx11::string::~string(local_2e0);
    std::__cxx11::string::~string(local_2c0);
    std::__cxx11::string::~string(local_2a0);
    Control::hLog(in_stack_fffffffffffffb60,logging);
  }
  if ((*(int *)&in_RDI[1].parameters_.super_ipx_parameters.logfile == 1) ||
     (*(int *)&in_RDI[1].parameters_.super_ipx_parameters.logfile == 2)) {
    Textline<char[37]>((char (*) [37])in_stack_fffffffffffffc08);
    poVar2 = std::operator<<(&local_180,local_400);
    sci2_abi_cxx11_(in_stack_fffffffffffffa68);
    poVar2 = std::operator<<(poVar2,local_420);
    poVar2 = std::operator<<(poVar2,'\n');
    Textline<char[35]>((char (*) [35])in_stack_fffffffffffffc08);
    poVar2 = std::operator<<(poVar2,local_440);
    sci2_abi_cxx11_(in_stack_fffffffffffffa68);
    poVar2 = std::operator<<(poVar2,local_460);
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string(local_460);
    std::__cxx11::string::~string(local_440);
    std::__cxx11::string::~string(local_420);
    std::__cxx11::string::~string(local_400);
    Control::hLog(in_stack_fffffffffffffb60,logging);
  }
  std::__cxx11::stringstream::~stringstream(local_190);
  return;
}

Assistant:

void LpSolver::PrintSummary() {
  std::stringstream h_logging_stream;
  h_logging_stream.str(std::string());
  h_logging_stream << "Summary\n";
  if (!control_.timelessLog())
    h_logging_stream << Textline("Runtime:") << fix2(control_.Elapsed()) << "s\n";
  h_logging_stream << Textline("Status interior point solve:")
                   << StatusString(info_.status_ipm) << '\n'
                   << Textline("Status crossover:")
                   << StatusString(info_.status_crossover) << '\n';
  control_.hLog(h_logging_stream);
  if (info_.status_ipm == IPX_STATUS_optimal ||
      info_.status_ipm == IPX_STATUS_imprecise) {
    h_logging_stream
      << Textline("objective value:") << sci8(info_.pobjval) << '\n'
      << Textline("interior solution primal residual (abs/rel):")
      << sci2(info_.abs_presidual) << " / " << sci2(info_.rel_presidual)
      << '\n'
      << Textline("interior solution dual residual (abs/rel):")
      << sci2(info_.abs_dresidual) << " / " << sci2(info_.rel_dresidual)
      << '\n'
      << Textline("interior solution objective gap (abs/rel):")
      << sci2(info_.pobjval-info_.dobjval) << " / "
      << sci2(info_.rel_objgap)  << '\n';
    control_.hLog(h_logging_stream);
  }
  if (info_.status_crossover == IPX_STATUS_optimal ||
      info_.status_crossover == IPX_STATUS_imprecise) {
    h_logging_stream
      << Textline("basic solution primal infeasibility:")
      << sci2(info_.primal_infeas) << '\n'
      << Textline("basic solution dual infeasibility:")
      << sci2(info_.dual_infeas) << '\n';
    control_.hLog(h_logging_stream);
  }
}